

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdFloat32x4OperationX86X64.cpp
# Opt level: O3

SIMDValue Js::SIMDFloat32x4Operation::OpFromInt32x4(SIMDValue *value)

{
  SIMDValue SVar1;
  
  SVar1.field_0.f32[1] = (float)(value->field_0).i32[1];
  SVar1.field_0.f32[0] = (float)(value->field_0).i32[0];
  SVar1.field_0.f32[3] = (float)(value->field_0).i32[3];
  SVar1.field_0.f32[2] = (float)(value->field_0).i32[2];
  return (SIMDValue)SVar1.field_0;
}

Assistant:

SIMDValue SIMDFloat32x4Operation::OpFromInt32x4(const SIMDValue& value)
    {
        X86SIMDValue x86Result;
        X86SIMDValue v = X86SIMDValue::ToX86SIMDValue(value);

        // Converts the 4 signed 32-bit integer values of v.m128i_value
        // to single-precision, floating-point values.
        x86Result.m128_value = _mm_cvtepi32_ps(v.m128i_value);

        return X86SIMDValue::ToSIMDValue(x86Result);
    }